

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.t.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int nprocs;
  int pid;
  int local_2c;
  int local_28;
  undefined1 local_24 [4];
  undefined1 local_20 [8];
  
  MPI_Init(local_24,local_20);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_28);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_2c);
  test_1((MPI_Comm)&ompi_mpi_comm_world,local_28,local_2c);
  MPI_Finalize();
  return 0;
}

Assistant:

int main( int argc, char ** argv ) 
{
    MPI_Init( &argc, &argv );

    MPI_Comm comm = MPI_COMM_WORLD;

    int pid, nprocs;
    MPI_Comm_rank( comm, & pid );
    MPI_Comm_size( comm, & nprocs );

    test_1( comm, pid, nprocs );

    MPI_Finalize( );
    return 0;
}